

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O2

void tcu::opt::registerLegacyOptions(Parser *parser)

{
  Option<tcu::opt::GLConfigName> local_78;
  Option<tcu::opt::GLConfigID> local_40;
  
  local_40.shortName = (char *)0x0;
  local_40.longName = "deqp-egl-config-id";
  local_40.description = "Legacy name for --deqp-gl-config-id";
  local_40.defaultValue = "-1";
  local_40.parse = de::cmdline::parseType<int>;
  local_40.namedValues = (NamedValue<int> *)0x0;
  local_40.namedValuesEnd = (NamedValue<int> *)0x0;
  de::cmdline::detail::Parser::addOption<tcu::opt::GLConfigID>(parser,&local_40);
  local_78.shortName = (char *)0x0;
  local_78.longName = "deqp-egl-config-name";
  local_78.description = "Legacy name for --deqp-gl-config-name";
  local_78.defaultValue = (char *)0x0;
  local_78.parse = de::cmdline::parseType<std::__cxx11::string>;
  local_78.namedValues =
       (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  local_78.namedValuesEnd =
       (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  de::cmdline::detail::Parser::addOption<tcu::opt::GLConfigName>(parser,&local_78);
  return;
}

Assistant:

void registerLegacyOptions (de::cmdline::Parser& parser)
{
	using de::cmdline::Option;

	parser
		<< Option<GLConfigID>			(DE_NULL,	"deqp-egl-config-id",			"Legacy name for --deqp-gl-config-id",	"-1")
		<< Option<GLConfigName>			(DE_NULL,	"deqp-egl-config-name",			"Legacy name for --deqp-gl-config-name");
}